

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O1

void __thiscall Clasp::Cli::ClaspAppBase::writeNonHcfs(ClaspAppBase *this,PrgDepGraph *graph)

{
  size_type sVar1;
  pointer pcVar2;
  SharedContext *this_00;
  uint uVar3;
  uint32 uVar4;
  int __fd;
  ulong uVar5;
  undefined4 extraout_var;
  Solver *pSVar6;
  uint uVar7;
  size_t sVar8;
  void *__buf;
  int iVar9;
  uint uVar10;
  pointer ppNVar11;
  WriteCnf cnf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  StringBuilder buf;
  WriteCnf local_b8;
  pointer local_a0;
  ClaspAppBase *local_98;
  string local_90;
  StringBuilder local_70;
  
  local_98 = this;
  Potassco::StringBuilder::StringBuilder(&local_70);
  uVar5 = (ulong)(graph->components_).ebo_.size;
  if (uVar5 != 0) {
    ppNVar11 = (graph->components_).ebo_.buf;
    local_a0 = ppNVar11 + uVar5;
    do {
      Potassco::StringBuilder::appendFormat(&local_70,".%u",(ulong)(*ppNVar11)->id_);
      Potassco::StringBuilder::c_str(&local_70);
      pcVar2 = (local_98->claspAppOpts_).hccOut._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,
                 pcVar2 + (local_98->claspAppOpts_).hccOut._M_string_length);
      std::__cxx11::string::append((char *)&local_90);
      WriteCnf::WriteCnf(&local_b8,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      this_00 = (*ppNVar11)->prg_;
      sVar1 = (this_00->varInfo_).ebo_.size;
      uVar4 = SharedContext::numConstraints(this_00);
      sVar8 = (size_t)uVar4;
      fprintf((FILE *)local_b8.str_,"p cnf %u %u\n",(ulong)(sVar1 - 1));
      WriteCnf::write(&local_b8,(this_00->varInfo_).ebo_.size - 1,&this_00->btig_,sVar8);
      pSVar6 = *(this_00->solvers_).ebo_.buf;
      if ((pSVar6->constraints_).ebo_.size != 0) {
        sVar8 = 0;
        do {
          iVar9 = (int)sVar8;
          __fd = (*(pSVar6->constraints_).ebo_.buf[sVar8]->_vptr_Constraint[9])();
          if (CONCAT44(extraout_var,__fd) != 0) {
            WriteCnf::write(&local_b8,__fd,__buf,sVar8);
          }
          uVar10 = iVar9 + 1;
          sVar8 = (size_t)uVar10;
        } while (uVar10 != (pSVar6->constraints_).ebo_.size);
      }
      pSVar6 = *(this_00->solvers_).ebo_.buf;
      if ((pSVar6->assign_).trail.ebo_.size != 0) {
        uVar5 = 0;
        do {
          uVar10 = (pSVar6->assign_).trail.ebo_.buf[uVar5].rep_;
          uVar7 = uVar10 >> 2;
          uVar3 = -uVar7;
          if ((uVar10 & 2) == 0) {
            uVar3 = uVar7;
          }
          fprintf((FILE *)local_b8.str_,"%d 0\n",(ulong)uVar3);
          uVar10 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar10;
          pSVar6 = *(this_00->solvers_).ebo_.buf;
        } while (uVar10 != (pSVar6->assign_).trail.ebo_.size);
      }
      if ((FILE *)local_b8.str_ != (FILE *)0x0) {
        fflush((FILE *)local_b8.str_);
        fclose((FILE *)local_b8.str_);
        local_b8.str_ = (FILE *)0x0;
      }
      Potassco::StringBuilder::resize(&local_70,0,'\0');
      WriteCnf::~WriteCnf(&local_b8);
      ppNVar11 = ppNVar11 + 1;
    } while (ppNVar11 != local_a0);
  }
  Potassco::StringBuilder::~StringBuilder(&local_70);
  return;
}

Assistant:

void ClaspAppBase::writeNonHcfs(const PrgDepGraph& graph) const {
	Potassco::StringBuilder buf;
	for (PrgDepGraph::NonHcfIter it = graph.nonHcfBegin(), end = graph.nonHcfEnd(); it != end; ++it) {
		buf.appendFormat(".%u", (*it)->id());
		WriteCnf cnf(claspAppOpts_.hccOut + buf.c_str());
		const SharedContext& ctx = (*it)->ctx();
		cnf.writeHeader(ctx.numVars(), ctx.numConstraints());
		cnf.write(ctx.numVars(), ctx.shortImplications());
		Solver::DBRef db = ctx.master()->constraints();
		for (uint32 i = 0; i != db.size(); ++i) {
			if (ClauseHead* x = db[i]->clause()) { cnf.write(x); }
		}
		for (uint32 i = 0; i != ctx.master()->trail().size(); ++i) {
			cnf.write(ctx.master()->trail()[i]);
		}
		cnf.close();
		buf.clear();
	}
}